

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

str pybind11::detail::enum_name(handle arg)

{
  handle h;
  PyObject *pPVar1;
  bool bVar2;
  int iVar3;
  object *poVar4;
  long in_RSI;
  object in_RDI;
  dict entries;
  dict_iterator __begin2;
  handle local_a0;
  handle local_98;
  PyObject *local_90;
  handle local_88;
  PyObject *pPStack_80;
  handle local_78;
  handle local_70;
  object local_68;
  accessor<pybind11::detail::accessor_policies::generic_item> local_60;
  PyObject *local_40;
  object_api<pybind11::handle> local_38 [8];
  
  local_88.m_ptr = *(PyObject **)(in_RSI + 8);
  pPStack_80 = (PyObject *)0x1fbf29;
  local_78.m_ptr = (PyObject *)0x0;
  dict::dict<pybind11::detail::accessor_policies::str_attr>
            ((dict *)&local_98,(accessor<pybind11::detail::accessor_policies::str_attr> *)&local_90)
  ;
  object::~object((object *)&local_78);
  local_90 = local_98.m_ptr;
  local_88.m_ptr = (PyObject *)0x0;
  pPStack_80 = (PyObject *)0x0;
  local_78.m_ptr = (PyObject *)0x0;
  iVar3 = PyDict_Next();
  if (iVar3 == 0) {
    local_78.m_ptr = (PyObject *)0xffffffffffffffff;
  }
  if (local_78.m_ptr != (PyObject *)0xffffffffffffffff) {
    do {
      pPVar1 = pPStack_80;
      h.m_ptr = local_88.m_ptr;
      int_::int_<int,_0>((int_ *)&local_70,0);
      if (local_70.m_ptr != (PyObject *)0x0) {
        (local_70.m_ptr)->ob_refcnt = (local_70.m_ptr)->ob_refcnt + 1;
      }
      local_60.obj.m_ptr = pPVar1;
      local_60.key.super_handle.m_ptr = (handle)(handle)local_70.m_ptr;
      local_68.super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_60.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      object::~object(&local_68);
      poVar4 = accessor<pybind11::detail::accessor_policies::generic_item>::get_cache(&local_60);
      local_a0.m_ptr = (poVar4->super_handle).m_ptr;
      if (local_a0.m_ptr != (PyObject *)0x0) {
        (local_a0.m_ptr)->ob_refcnt = (local_a0.m_ptr)->ob_refcnt + 1;
      }
      local_40 = local_a0.m_ptr;
      bVar2 = object_api<pybind11::handle>::rich_compare
                        ((object_api<pybind11::handle> *)&local_40,local_38,2);
      object::~object((object *)&local_a0);
      object::~object(&local_60.cache);
      object::~object(&local_60.key);
      object::~object((object *)&local_70);
      if (bVar2) {
        str::str((str *)in_RDI.super_handle.m_ptr,h);
        if (bVar2) goto LAB_001b8cdc;
      }
      iVar3 = PyDict_Next(local_90,&local_78,&local_88,&pPStack_80);
      if (iVar3 == 0) {
        local_78.m_ptr = (PyObject *)0xffffffffffffffff;
      }
    } while (local_78.m_ptr != (PyObject *)0xffffffffffffffff);
  }
  str::str((str *)in_RDI.super_handle.m_ptr,"???");
LAB_001b8cdc:
  object::~object((object *)&local_98);
  return (str)in_RDI.super_handle.m_ptr;
}

Assistant:

inline str enum_name(handle arg) {
    dict entries = arg.get_type().attr("__entries");
    for (auto kv : entries) {
        if (handle(kv.second[int_(0)]).equal(arg))
            return pybind11::str(kv.first);
    }
    return "???";
}